

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O3

bool cppcms::url_dispatcher::parse<stuff::foo>
               (application *app,const_char_istream *p,cmatch *m,int group,foo *v)

{
  long lVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  char *begin;
  long lVar7;
  
  if (group < 0) {
    lVar7 = 0;
    cVar2 = cppcms::url_dispatcher::validate_encoding(app,(char *)0x0,(char *)0x0);
    lVar6 = 0;
    if (cVar2 == '\0') goto LAB_0012e455;
  }
  else {
    lVar7 = *(long *)(m + 0x10);
    if (group < (int)((ulong)(*(long *)(m + 0x18) - lVar7) >> 3)) {
      lVar6 = (long)*(int *)(lVar7 + (ulong)(uint)group * 8);
      pcVar3 = (char *)0x0;
      pcVar4 = pcVar3;
      if (lVar6 != -1) {
        pcVar3 = (char *)((long)*(int *)(lVar7 + 4 + (ulong)(uint)group * 8) + *(long *)m);
        pcVar4 = (char *)(*(long *)m + lVar6);
      }
    }
    else {
      pcVar3 = (char *)0x0;
      pcVar4 = (char *)0x0;
    }
    cVar2 = cppcms::url_dispatcher::validate_encoding(app,pcVar4,pcVar3);
    if (cVar2 == '\0') {
      lVar7 = 0;
      goto LAB_0012e455;
    }
    lVar1 = *(long *)(m + 0x10);
    if (group < (int)((ulong)(*(long *)(m + 0x18) - lVar1) >> 3)) {
      lVar5 = (long)*(int *)(lVar1 + (ulong)(uint)group * 8);
      lVar6 = 0;
      lVar7 = lVar6;
      if (lVar5 != -1) {
        lVar6 = (long)*(int *)(lVar1 + 4 + (ulong)(uint)group * 8) + *(long *)m;
        lVar7 = *(long *)m + lVar5;
      }
    }
    else {
      lVar6 = 0;
      lVar7 = 0;
    }
  }
  *(long *)&(p->super_istream).field_0x18 = lVar7;
  *(long *)&(p->super_istream).field_0x20 = lVar7;
  *(long *)&(p->super_istream).field_0x28 = lVar6;
  std::ios::clear((int)(p->super_istream)._vptr_basic_istream[-3] + (int)p);
  v->l = *(int *)&(p->super_istream).field_0x28 - *(int *)&(p->super_istream).field_0x18;
  lVar7 = 1;
LAB_0012e455:
  return SUB81(lVar7,0);
}

Assistant:

static bool parse(application &app,util::const_char_istream &p,booster::cmatch const &m,int group,T &v)
		{
			if(!validate_encoding(app,m[group].first,m[group].second))
				return false;
			p.range(m[group].first,m[group].second);
			return parse_url_parameter(p,v);
		}